

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,char **it)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  byte bVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  
  uVar5 = *(ulong *)this;
  pcVar3 = *it + *(uint *)(this + 8);
  pcVar6 = pcVar3;
  uVar7 = uVar5;
  if (99 < uVar5) {
    do {
      uVar5 = uVar7 / 100;
      *(undefined2 *)(pcVar6 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uint)((int)uVar7 + (int)uVar5 * -100) * 2)
      ;
      pcVar6 = pcVar6 + -2;
      bVar1 = 9999 < uVar7;
      uVar7 = uVar5;
    } while (bVar1);
  }
  if (uVar5 < 10) {
    bVar4 = (byte)uVar5 | 0x30;
    lVar2 = -1;
  }
  else {
    pcVar6[-1] = internal::basic_data<void>::DIGITS[(uVar5 * 2 & 0xffffffff) + 1];
    bVar4 = internal::basic_data<void>::DIGITS[uVar5 * 2 & 0x1fffffffe];
    lVar2 = -2;
  }
  pcVar6[lVar2] = bVar4;
  *it = pcVar3;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal(it, abs_value, num_digits);
      }